

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# junction.cpp
# Opt level: O0

void __thiscall Junction::Junction(Junction *this,string *name_)

{
  string local_38 [32];
  string *local_18;
  string *name__local;
  Junction *this_local;
  
  local_18 = name_;
  name__local = (string *)this;
  std::__cxx11::string::string(local_38,(string *)name_);
  Node::Node(&this->super_Node,(string *)local_38);
  std::__cxx11::string::~string(local_38);
  (this->super_Node).super_Element._vptr_Element = (_func_int **)&PTR__Junction_0019ebe8;
  Demand::Demand(&this->primaryDemand);
  std::__cxx11::list<Demand,_std::allocator<Demand>_>::list(&this->demands);
  this->pMin = -999999999.9;
  this->pFull = -999999999.9;
  this->emitter = (Emitter *)0x0;
  return;
}

Assistant:

Junction::Junction(string name_):
    Node(name_),
    pMin(MISSING),
    pFull(MISSING),
    emitter(nullptr)
{
}